

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChDampingReissner::ComputeDampingMatrix
          (ChDampingReissner *this,ChMatrixRef *R,ChVector<double> *deps_u,ChVector<double> *deps_v,
          ChVector<double> *dkur_u,ChVector<double> *dkur_v,double z_inf,double z_sup,double angle)

{
  long lVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  SrcEvaluatorType srcEvaluator;
  ChVector<double> nu;
  Index alignedStart_2;
  Index alignedStart_1;
  Index alignedEnd;
  ChVector<double> mv;
  ChVector<double> mu;
  ChVector<double> nv;
  ChVectorN<double,_12> dstrain_0;
  ChVectorN<double,_12> stress_0;
  ChVector<double> ddkur_u;
  ChVector<double> ddeps_v;
  ChVector<double> ddeps_u;
  ChVectorN<double,_12> stress_d;
  ChVector<double> ddkur_v;
  SrcEvaluatorType local_360;
  undefined8 uStack_350;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *pgStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [16];
  long local_2f0;
  undefined1 *local_2e8;
  void *local_2e0;
  undefined1 *local_2d8;
  void *local_2d0;
  undefined1 *local_2c8;
  void *local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  ulong local_280;
  ulong local_278;
  ulong local_270;
  ChMatrixRef *local_268;
  undefined1 local_260 [16];
  undefined8 local_250;
  undefined1 local_240 [16];
  undefined8 local_230;
  undefined1 local_220 [16];
  undefined8 local_210;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_200;
  undefined1 local_1d0 [24];
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  DstEvaluatorType local_1a0;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  ChVector<double> local_128;
  ChVector<double> local_110;
  ChVector<double> local_f8;
  double local_e0 [14];
  ChVector<double> local_70 [2];
  
  if ((R->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value != 0xc) {
    __assert_fail("R.rows() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellReissner.cpp"
                  ,0x248,
                  "virtual void chrono::fea::ChDampingReissner::ComputeDampingMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
                 );
  }
  if ((R->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 0xc) {
    local_200.m_src = &local_360;
    local_360.m_functor.m_other = 0.0;
    local_1a0.
    super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_data = (R->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_data;
    local_200.m_dst = &local_1a0;
    local_1a0.
    super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
    .m_outerStride.m_value =
         (R->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).m_stride.m_outer.m_value;
    local_200.m_functor = (assign_op<double,_double> *)local_e0;
    local_268 = R;
    local_200.m_dstExpr = R;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_200);
    memcpy(&local_200,deps_u,0x18);
    uVar13 = -((uint)((ulong)&local_200.m_dstExpr >> 3) & 0x1fffffff) & 5;
    if (2 < uVar13) {
      uVar13 = 3;
    }
    memcpy(&local_200.m_dstExpr,deps_v,(ulong)(uVar13 * 8));
    if (uVar13 != 3) {
      uVar8 = (ulong)(uVar13 << 3);
      memcpy((void *)((long)&local_200.m_dstExpr + uVar8),(void *)((long)deps_v->m_data + uVar8),
             0x18 - uVar8);
    }
    uVar7 = -((uint)((ulong)local_1d0 >> 3) & 0x1fffffff) & 6;
    uVar13 = 3;
    if (uVar7 < 3) {
      uVar13 = uVar7;
    }
    memcpy(local_1d0,dkur_u,(ulong)(uVar13 * 8));
    if (uVar13 != 3) {
      uVar8 = (ulong)(uVar13 << 3);
      memcpy(local_1d0 + uVar8,(void *)((long)dkur_u->m_data + uVar8),0x18 - uVar8);
    }
    local_1a8 = dkur_v->m_data[2];
    local_1b8 = dkur_v->m_data[0];
    dStack_1b0 = dkur_v->m_data[1];
    local_2f0 = 0;
    local_300 = ZEXT816(0) << 0x20;
    local_210 = 0;
    local_230 = 0;
    local_250 = 0;
    local_260 = local_300;
    local_240 = local_300;
    local_220 = local_300;
    (*this->_vptr_ChDampingReissner[2])(z_inf,z_sup,angle);
    uVar7 = -((uint)((ulong)&local_1a0 >> 3) & 0x1fffffff) & 4;
    uVar13 = 3;
    if (uVar7 < 3) {
      uVar13 = uVar7;
    }
    if (uVar7 != 0) {
      local_1a0.
      super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
      .m_outerStride.m_value = local_2f0;
      local_1a0.
      super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
      .m_data = (PointerType)local_300._0_8_;
      local_1a0.
      super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
      ._8_8_ = local_300._8_8_;
    }
    if (uVar13 != 3) {
      uVar8 = (ulong)(uVar13 << 3);
      memcpy((void *)((long)&local_1a0.
                             super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                             .m_data + uVar8),local_300 + uVar8,0x18 - uVar8);
    }
    uVar13 = -((uint)((ulong)&uStack_188 >> 3) & 0x1fffffff) & 5;
    if (2 < uVar13) {
      uVar13 = 3;
    }
    memcpy(&uStack_188,local_220,(ulong)(uVar13 * 8));
    if (uVar13 != 3) {
      uVar8 = (ulong)(uVar13 << 3);
      memcpy(local_180 + (uVar8 - 8),local_220 + uVar8,0x18 - uVar8);
    }
    uVar7 = -((uint)((ulong)(local_180 + 0x10) >> 3) & 0x1fffffff) & 6;
    uVar13 = 3;
    if (uVar7 < 3) {
      uVar13 = uVar7;
    }
    memcpy(local_180 + 0x10,local_240,(ulong)(uVar13 * 8));
    if (uVar13 != 3) {
      uVar8 = (ulong)(uVar13 << 3);
      memcpy(local_180 + uVar8 + 0x10,local_240 + uVar8,0x18 - uVar8);
    }
    uStack_148 = local_250;
    uStack_158 = local_260._0_8_;
    uStack_150 = local_260._8_8_;
    local_270 = (ulong)(-((uint)((ulong)&local_360 >> 3) & 0x1fffffff) & 4);
    local_278 = 3;
    if (local_270 < 3) {
      local_278 = local_270;
    }
    local_280 = (ulong)(-((uint)((ulong)&pgStack_348 >> 3) & 0x1fffffff) & 5);
    if (2 < local_280) {
      local_280 = 3;
    }
    local_288 = (ulong)(-((uint)((ulong)&uStack_330 >> 3) & 0x1fffffff) & 6);
    if (2 < local_288) {
      local_288 = 3;
    }
    local_2a0 = (ulong)(uint)((int)local_278 * 8);
    local_2a8 = local_2a0 ^ 0x18;
    local_290 = (ulong)(uint)((int)local_280 * 8);
    local_2b0 = local_290 ^ 0x18;
    local_298 = (ulong)(uint)((int)local_288 * 8);
    local_2b8 = local_298 ^ 0x18;
    local_2c0 = (void *)((long)&local_360.m_functor.m_other + local_2a0);
    local_2c8 = local_300 + local_2a0;
    local_2d0 = (void *)((long)&pgStack_348 + local_290);
    local_2d8 = local_220 + local_290;
    local_2e0 = (void *)((long)&uStack_330 + local_298);
    local_2e8 = local_240 + local_298;
    lVar12 = 0;
    lVar11 = 0;
    while( true ) {
      (&local_200.m_dst)[lVar11] = (DstEvaluatorType *)((double)(&local_200.m_dst)[lVar11] + 1e-09);
      local_360._8_8_ = 3;
      local_340 = 0;
      uStack_330 = 0xc;
      local_360.m_functor.m_other = (double)&local_200;
      pgStack_348 = &local_200;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_f8,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_360,(type *)0x0);
      local_360.m_functor.m_other = (double)&local_200.m_dstExpr;
      local_360._8_8_ = 3;
      local_340 = 3;
      uStack_330 = 0xc;
      pgStack_348 = &local_200;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_110,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_360,(type *)0x0);
      local_360.m_functor.m_other = (double)local_1d0;
      local_360._8_8_ = 3;
      local_340 = 6;
      uStack_330 = 0xc;
      pgStack_348 = &local_200;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_128,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_360,(type *)0x0);
      local_360.m_functor.m_other = (double)&local_1b8;
      local_360._8_8_ = 3;
      local_340 = 9;
      uStack_330 = 0xc;
      pgStack_348 = &local_200;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (local_70,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_>
                           *)&local_360,(type *)0x0);
      (*this->_vptr_ChDampingReissner[2])
                (z_inf,z_sup,angle,this,local_300,local_220,local_240,local_260,&local_f8,&local_110
                 ,&local_128,local_70);
      if (local_270 != 0) {
        memcpy(&local_360,local_300,local_2a0);
      }
      if ((int)local_278 != 3) {
        memcpy(local_2c0,local_2c8,local_2a8);
      }
      memcpy(&pgStack_348,local_220,local_290);
      if ((int)local_280 != 3) {
        memcpy(local_2d0,local_2d8,local_2b0);
      }
      memcpy(&uStack_330,local_240,local_298);
      if ((int)local_288 != 3) {
        memcpy(local_2e0,local_2e8,local_2b8);
      }
      uStack_308 = local_250;
      uStack_318 = local_260._0_8_;
      uStack_310 = local_260._8_8_;
      auVar2._8_8_ = local_360._8_8_;
      auVar2._0_8_ = local_360.m_functor.m_other;
      auVar2._16_8_ = uStack_350;
      auVar2._24_8_ = pgStack_348;
      auVar3._8_8_ = uStack_338;
      auVar3._0_8_ = local_340;
      auVar3._16_8_ = uStack_330;
      auVar3._24_8_ = uStack_328;
      auVar4._8_8_ = local_260._0_8_;
      auVar4._0_8_ = local_320;
      auVar4._16_8_ = local_260._8_8_;
      auVar4._24_8_ = local_250;
      auVar5._8_8_ = local_1a0.
                     super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                     ._8_8_;
      auVar5._0_8_ = local_1a0.
                     super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                     .m_data;
      auVar5._16_8_ =
           local_1a0.
           super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
           .m_outerStride.m_value;
      auVar5._24_8_ = uStack_188;
      auVar2 = vsubpd_avx(auVar2,auVar5);
      local_e0[0] = auVar2._0_8_ * 999999999.9999999;
      local_e0[1] = auVar2._8_8_ * 999999999.9999999;
      local_e0[2] = auVar2._16_8_ * 999999999.9999999;
      local_e0[3] = auVar2._24_8_ * 999999999.9999999;
      auVar2 = vsubpd_avx(auVar3,local_180);
      local_e0[4] = auVar2._0_8_ * 999999999.9999999;
      local_e0[5] = auVar2._8_8_ * 999999999.9999999;
      local_e0[6] = auVar2._16_8_ * 999999999.9999999;
      local_e0[7] = auVar2._24_8_ * 999999999.9999999;
      auVar6._8_8_ = uStack_158;
      auVar6._0_8_ = local_160;
      auVar6._16_8_ = uStack_150;
      auVar6._24_8_ = uStack_148;
      auVar2 = vsubpd_avx(auVar4,auVar6);
      local_e0[8] = auVar2._0_8_ * 999999999.9999999;
      local_e0[9] = auVar2._8_8_ * 999999999.9999999;
      local_e0[10] = auVar2._16_8_ * 999999999.9999999;
      local_e0[0xb] = auVar2._24_8_ * 999999999.9999999;
      if (((local_268->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < 0xc) ||
         ((local_268->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar11)) break;
      lVar1 = (local_268->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value;
      pdVar9 = (double *)
               ((long)(local_268->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      ).
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      .
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_data + lVar12);
      lVar10 = 0;
      do {
        *pdVar9 = local_e0[lVar10];
        lVar10 = lVar10 + 1;
        pdVar9 = pdVar9 + lVar1;
      } while (lVar10 != 0xc);
      (&local_200.m_dst)[lVar11] = (DstEvaluatorType *)((double)(&local_200.m_dst)[lVar11] + -1e-09)
      ;
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 8;
      if (lVar11 == 0xc) {
        return;
      }
    }
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  __assert_fail("R.cols() == 12",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellReissner.cpp"
                ,0x249,
                "virtual void chrono::fea::ChDampingReissner::ComputeDampingMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
               );
}

Assistant:

void ChDampingReissner::ComputeDampingMatrix(
    ChMatrixRef R,             // 12x12 material damping matrix values here
    const ChVector<>& deps_u,  // time derivative of strains along \e u direction
    const ChVector<>& deps_v,  // time derivative of strains along \e v direction
    const ChVector<>& dkur_u,  // time derivative of curvature along \e u direction
    const ChVector<>& dkur_v,  // time derivative of curvature along \e v direction
    const double z_inf,        // layer lower z value (along thickness coord)
    const double z_sup,        // layer upper z value (along thickness coord)
    const double angle         // layer angle respect to x (if needed) -not used in this, isotropic+
) {
    assert(R.rows() == 12);
    assert(R.cols() == 12);

    R.setZero();

    ChVectorN<double, 12> dstrain_0;
    dstrain_0.segment(0, 3) = deps_u.eigen();
    dstrain_0.segment(3, 3) = deps_v.eigen();
    dstrain_0.segment(6, 3) = dkur_u.eigen();
    dstrain_0.segment(9, 3) = dkur_v.eigen();

    ChVector<> nu, nv, mu, mv;
    this->ComputeStress(nu, nv, mu, mv, deps_u, deps_v, dkur_u, dkur_v, z_inf, z_sup, angle);

    ChVectorN<double, 12> stress_0;
    stress_0.segment(0,3) = nu.eigen();
    stress_0.segment(3,3) = nv.eigen();
    stress_0.segment(6,3) = mu.eigen();
    stress_0.segment(9,3) = mv.eigen();

    double delta = 1e-9;
    for (int i = 0; i < 12; ++i) {
        dstrain_0(i, 0) += delta;
        ChVector<> ddeps_u(dstrain_0.segment(0, 3));
        ChVector<> ddeps_v(dstrain_0.segment(3, 3));
        ChVector<> ddkur_u(dstrain_0.segment(6, 3));
        ChVector<> ddkur_v(dstrain_0.segment(9, 3));
        this->ComputeStress(nu, nv, mu, mv, ddeps_u, ddeps_v, ddkur_u, ddkur_v, z_inf, z_sup, angle);
        ChVectorN<double, 12> stress_1;
        stress_1.segment(0,3) = nu.eigen();
        stress_1.segment(3,3) = nv.eigen();
        stress_1.segment(6,3) = mu.eigen();
        stress_1.segment(9,3) = mv.eigen();
        ChVectorN<double, 12> stress_d = (1. / delta) * (stress_1 - stress_0);
        R.block(0, i, 12, 1) = stress_d;
        dstrain_0(i, 0) -= delta;
    }
}